

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  Mat *this_01;
  uint uVar1;
  int iVar2;
  int iVar3;
  int z;
  pointer pMVar4;
  int q;
  int iVar5;
  uint uVar6;
  void *__arg;
  int _elempack;
  ulong uVar7;
  Mat *m;
  int local_1bc;
  int _outw;
  int _outh;
  int local_1b0;
  int _woffset;
  pointer local_1a8;
  int local_1a0;
  int _outc;
  int _outd;
  int _hoffset;
  int _coffset;
  int local_18c;
  int local_188;
  int _doffset;
  size_t local_180;
  int local_174;
  Mat *local_170;
  Mat reference_blob_unpacked;
  Mat bottom_blob_unpacked;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Mat local_78;
  
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  m = this_01 + 1;
  iVar3 = this_01->elempack;
  iVar5 = this_01[1].elempack;
  if (iVar3 == 4) {
    local_1b0 = this_01->w;
    local_1a0 = this_01->h;
    local_188 = this_01->d;
    local_18c = this_01->c;
    iVar2 = this_01->dims;
    local_180 = this_01->elemsize;
    local_1a8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
    local_174 = iVar3;
    local_170 = m;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) == -0xe9) {
      Mat::shape(&bottom_blob_unpacked,this_01);
      Crop::resolve_crop_roi
                (this_00,&bottom_blob_unpacked,(int *)this_01[1].data,&_woffset,&_hoffset,&_doffset,
                 &_coffset,&_outw,&_outh,&_outd,&_outc);
    }
    else {
      Mat::shape(&bottom_blob_unpacked,this_01);
      Mat::shape(&reference_blob_unpacked,local_170);
      Crop::resolve_crop_roi
                (this_00,&bottom_blob_unpacked,&reference_blob_unpacked,&_woffset,&_hoffset,
                 &_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
      Mat::~Mat(&reference_blob_unpacked);
    }
    Mat::~Mat(&bottom_blob_unpacked);
    pMVar4 = local_1a8;
    m = local_170;
    iVar3 = local_174;
    if (iVar2 - 1U < 4) {
      uVar6 = _outc >> 2;
      switch(iVar2) {
      case 1:
        uVar6 = _outw & 3;
        _elempack = (uint)(uVar6 == 0) * 3 + 1;
        iVar2 = _outw / _elempack;
        if (local_1b0 != iVar2 || uVar6 != 0) {
          if (((_outw | _woffset) & 3U) == 0) {
            Mat::create(local_1a8,iVar2,(local_180 >> 2) << (uVar6 == 0) * '\x02',_elempack,
                        opt->blob_allocator);
            if (pMVar4->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar4->c * pMVar4->cstep != 0) {
              crop_pack4_sse(this_01,pMVar4,0,_woffset / 4);
              return 0;
            }
            return -100;
          }
          goto LAB_001a987e;
        }
        break;
      case 2:
        if (((_outw != local_1b0) || ((_outh & 3U) != 0)) ||
           (_outh / (int)((uint)((_outh & 3U) == 0) * 3 + 1) != local_1a0)) {
          if (((_hoffset | _outh) & 3U) == 0) {
            Mat::create(local_1a8,_outw,_outh >> 2,(local_180 >> 2) << ((_outh & 3U) == 0) * '\x02',
                        4,opt->blob_allocator);
            if (pMVar4->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar4->c * pMVar4->cstep != 0) {
              crop_pack4_sse(this_01,pMVar4,_hoffset / 4,_woffset);
              return 0;
            }
            return -100;
          }
          goto LAB_001a987e;
        }
        break;
      case 3:
        uVar1 = _outc & 3;
        uVar7 = local_180 >> 2;
        if ((((_outw != local_1b0) || (_outh != local_1a0)) || ((_outc & 3U) != 0)) ||
           (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) != local_18c)) {
          if (((_coffset | _outc) & 3U) == 0) {
            __arg = (void *)(ulong)uVar6;
            Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset >> 2,uVar6);
            pMVar4 = local_1a8;
            if (local_1a0 == _outh && local_1b0 == _outw) {
              Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outh,
                         __arg);
              Mat::operator=(pMVar4,&reference_blob_unpacked);
              Mat::~Mat(&reference_blob_unpacked);
              iVar3 = -100;
              if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0))
              goto LAB_001a9ac3;
            }
            Mat::create(pMVar4,_outw,_outh,_outc / 4,uVar7 << (uVar1 == 0) * '\x02',4,
                        opt->blob_allocator);
            iVar3 = -100;
            if ((pMVar4->data != (void *)0x0) &&
               (uVar7 = (ulong)pMVar4->c, pMVar4->cstep * uVar7 != 0)) {
              for (iVar5 = 0; iVar3 = 0, iVar5 < (int)uVar7; iVar5 = iVar5 + 1) {
                Mat::channel(&reference_blob_unpacked,&bottom_blob_unpacked,iVar5);
                Mat::channel((Mat *)&bottom_blobs_unpacked,pMVar4,iVar5);
                crop_pack4_sse(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,
                               _woffset);
                Mat::~Mat((Mat *)&bottom_blobs_unpacked);
                Mat::~Mat(&reference_blob_unpacked);
                uVar7 = (ulong)(uint)pMVar4->c;
              }
            }
LAB_001a9ac3:
            local_1bc = iVar3;
            Mat::~Mat(&bottom_blob_unpacked);
            return local_1bc;
          }
          goto LAB_001a987e;
        }
        break;
      case 4:
        uVar1 = _outc & 3;
        uVar7 = local_180 >> 2;
        if ((((_outw != local_1b0) || (_outh != local_1a0)) || (_outd != local_188)) ||
           (((_outc & 3U) != 0 || (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) != local_18c))))
        {
          if (((_coffset | _outc) & 3U) == 0) {
            local_1bc = -100;
            Mat::channel_range(&bottom_blob_unpacked,this_01,_coffset >> 2,uVar6);
            pMVar4 = local_1a8;
            if (local_188 == _outd && (local_1a0 == _outh && local_1b0 == _outw)) {
              Mat::clone(&reference_blob_unpacked,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outd,
                         (void *)(ulong)(uint)_outh);
              pMVar4 = local_1a8;
              Mat::operator=(local_1a8,&reference_blob_unpacked);
              Mat::~Mat(&reference_blob_unpacked);
              iVar3 = -100;
              if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0))
              goto LAB_001a9ac3;
            }
            Mat::create(pMVar4,_outw,_outh,_outd,_outc / 4,uVar7 << (uVar1 == 0) * '\x02',4,
                        opt->blob_allocator);
            iVar3 = local_1bc;
            if ((pMVar4->data != (void *)0x0) &&
               (uVar7 = (ulong)pMVar4->c, pMVar4->cstep * uVar7 != 0)) {
              local_1bc = 0;
              for (iVar5 = 0; iVar3 = local_1bc, iVar5 < (int)uVar7; iVar5 = iVar5 + 1) {
                for (iVar3 = 0; iVar3 < _outd; iVar3 = iVar3 + 1) {
                  Mat::channel((Mat *)&bottom_blobs_unpacked,&bottom_blob_unpacked,iVar5);
                  Mat::depth(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_doffset + iVar3
                            );
                  Mat::~Mat((Mat *)&bottom_blobs_unpacked);
                  Mat::channel(&local_78,local_1a8,iVar5);
                  Mat::depth((Mat *)&bottom_blobs_unpacked,&local_78,iVar3);
                  Mat::~Mat(&local_78);
                  crop_pack4_sse(&reference_blob_unpacked,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  Mat::~Mat((Mat *)&bottom_blobs_unpacked);
                  Mat::~Mat(&reference_blob_unpacked);
                }
                uVar7 = (ulong)(uint)local_1a8->c;
              }
            }
            goto LAB_001a9ac3;
          }
          goto LAB_001a987e;
        }
      }
      Mat::operator=(local_1a8,this_01);
      return 0;
    }
  }
LAB_001a987e:
  Mat::Mat(&bottom_blob_unpacked,this_01);
  if (iVar3 != 1) {
    reference_blob_unpacked.data = *(void **)opt;
    reference_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
    reference_blob_unpacked.elempack = opt->openmp_blocktime;
    reference_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    reference_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    reference_blob_unpacked._30_1_ = opt->use_int8_inference;
    reference_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    reference_blob_unpacked.allocator = *(Allocator **)&opt->use_bf16_storage;
    reference_blob_unpacked._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    reference_blob_unpacked._48_8_ = *(undefined8 *)&opt->flush_denormals;
    reference_blob_unpacked._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    reference_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    convert_packing(this_01,&bottom_blob_unpacked,1,(Option *)&reference_blob_unpacked);
  }
  Mat::Mat(&reference_blob_unpacked,m);
  if (iVar5 != 1) {
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(m,&reference_blob_unpacked,1,(Option *)&bottom_blobs_unpacked);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,2,(allocator_type *)&local_78);
  Mat::operator=(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start,&bottom_blob_unpacked);
  Mat::operator=(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1,&reference_blob_unpacked);
  iVar3 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                        &bottom_blobs_unpacked,top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  Mat::~Mat(&reference_blob_unpacked);
  Mat::~Mat(&bottom_blob_unpacked);
  return iVar3;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}